

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int PHYSFS_enumerate(char *_fn,PHYSFS_EnumerateCallback cb,void *data)

{
  DirHandle *h;
  void *pvVar1;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var2;
  PHYSFS_Archiver *pPVar3;
  _func_PHYSFS_EnumerateCallbackResult_void_ptr_char_ptr_PHYSFS_EnumerateCallback_char_ptr_void_ptr
  *p_Var4;
  undefined8 uVar5;
  char *pcVar6;
  int iVar7;
  PHYSFS_EnumerateCallbackResult PVar8;
  int iVar9;
  PHYSFS_ErrorCode PVar10;
  size_t sVar11;
  void *pvVar12;
  uint uVar14;
  undefined1 *puVar15;
  size_t len;
  undefined1 *ptr;
  DirHandle **ppDVar16;
  char *dst;
  undefined1 local_98 [8];
  PHYSFS_Stat statbuf;
  char *local_40;
  char *arcfname;
  ulong uVar13;
  
  puVar15 = local_98;
  if ((_fn == (char *)0x0) || (cb == (PHYSFS_EnumerateCallback)0x0)) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    sVar11 = strlen(_fn);
    len = longest_root + sVar11 + 1;
    if (len < 0x100) {
      puVar15 = local_98 + -(longest_root + sVar11 + 0x18 & 0xfffffffffffffff0);
      ptr = puVar15;
    }
    else {
      ptr = (undefined1 *)0x0;
    }
    *(undefined8 *)(puVar15 + -8) = 0x108091;
    pvVar12 = __PHYSFS_initSmallAlloc(ptr,len);
    if (pvVar12 != (void *)0x0) {
      dst = (char *)(longest_root + (long)pvVar12);
      *(undefined8 *)(puVar15 + -8) = 0x1080b2;
      iVar7 = sanitizePlatformIndependentPath(_fn,dst);
      if (iVar7 == 0) {
        *(undefined8 *)(puVar15 + -8) = 1;
        uVar14 = (uint)*(undefined8 *)(puVar15 + -8);
      }
      else {
        if (allowSymLinks == 0) {
          statbuf._32_8_ = cb;
        }
        *(undefined8 *)(puVar15 + -8) = 1;
        uVar13 = *(ulong *)(puVar15 + -8);
        ppDVar16 = &searchPath;
        arcfname = (char *)cb;
        while (((int)uVar13 == 1 && (h = *ppDVar16, h != (DirHandle *)0x0))) {
          local_40 = dst;
          *(undefined8 *)(puVar15 + -8) = 0x10810e;
          iVar7 = partOfMountPoint(h,dst);
          if (iVar7 == 0) {
            *(undefined8 *)(puVar15 + -8) = 0x108133;
            iVar7 = verifyPath(h,&local_40,0);
            *(undefined8 *)(puVar15 + -8) = 1;
            pcVar6 = local_40;
            uVar13 = *(ulong *)(puVar15 + -8);
            if (iVar7 != 0) {
              pvVar1 = h->opaque;
              p_Var2 = h->funcs->stat;
              *(undefined8 *)(puVar15 + -8) = 0x108159;
              iVar9 = (*p_Var2)(pvVar1,pcVar6,(PHYSFS_Stat *)local_98);
              iVar7 = (int)statbuf.accesstime;
              if (iVar9 == 0) {
                *(undefined8 *)(puVar15 + -8) = 0x10816d;
                PVar10 = currentErrorCode();
                *(undefined8 *)(puVar15 + -8) = 1;
                uVar13 = *(ulong *)(puVar15 + -8);
                cb = (PHYSFS_EnumerateCallback)arcfname;
                iVar7 = (int)statbuf.accesstime;
                if (PVar10 == PHYSFS_ERR_NOT_FOUND) goto LAB_001081a6;
              }
              else {
                *(undefined8 *)(puVar15 + -8) = 1;
                uVar13 = *(ulong *)(puVar15 + -8);
                cb = (PHYSFS_EnumerateCallback)arcfname;
              }
              arcfname = (char *)cb;
              if (iVar7 == 1) {
                pPVar3 = h->funcs;
                if ((allowSymLinks == 0) && ((pPVar3->info).supportsSymlinks != 0)) {
                  pvVar1 = h->opaque;
                  p_Var4 = pPVar3->enumerate;
                  *(undefined8 *)(puVar15 + -8) = 0x1081d9;
                  PVar8 = (*p_Var4)(pvVar1,pcVar6,enumCallbackFilterSymLinks,_fn,&statbuf.filetype);
                  uVar13 = (ulong)(uint)PVar8;
                  cb = (PHYSFS_EnumerateCallback)arcfname;
                  if (PVar8 == PHYSFS_ENUM_ERROR) {
                    *(undefined8 *)(puVar15 + -8) = 0x1081e3;
                    PVar10 = currentErrorCode();
                    *(undefined8 *)(puVar15 + -8) = 0xffffffffffffffff;
                    uVar13 = *(ulong *)(puVar15 + -8);
                    cb = (PHYSFS_EnumerateCallback)arcfname;
                    if (PVar10 == PHYSFS_ERR_APP_CALLBACK) {
                      *(undefined8 *)(puVar15 + -8) = 0x1081f5;
                      PHYSFS_setErrorCode(PHYSFS_ERR_OK);
                      *(undefined8 *)(puVar15 + -8) = 0xffffffffffffffff;
                      uVar13 = *(ulong *)(puVar15 + -8);
                      cb = (PHYSFS_EnumerateCallback)arcfname;
                    }
                  }
                }
                else {
                  pvVar1 = h->opaque;
                  p_Var4 = pPVar3->enumerate;
                  *(undefined8 *)(puVar15 + -8) = 0x10819f;
                  PVar8 = (*p_Var4)(pvVar1,pcVar6,cb,_fn,data);
                  uVar13 = (ulong)(uint)PVar8;
                  cb = (PHYSFS_EnumerateCallback)arcfname;
                }
              }
            }
          }
          else {
            *(undefined8 *)(puVar15 + -8) = 0x108126;
            PVar8 = enumerateFromMountPoint(h,dst,cb,_fn,data);
            uVar13 = (ulong)(uint)PVar8;
          }
LAB_001081a6:
          ppDVar16 = &h->next;
        }
        uVar14 = (uint)((int)uVar13 != -1);
      }
      *(undefined8 *)(puVar15 + -8) = 0x108230;
      __PHYSFS_platformReleaseMutex(stateLock);
      if (*(long *)((long)pvVar12 + -8) == 0) {
        return uVar14;
      }
      *(undefined8 *)(puVar15 + -8) = 0x108249;
      (*__PHYSFS_AllocatorHooks.Free)((void *)((long)pvVar12 + -8));
      return uVar14;
    }
    *(undefined8 *)(puVar15 + -8) = 2;
    uVar5 = *(undefined8 *)(puVar15 + -8);
    *(undefined8 *)(puVar15 + -8) = 0x108210;
    PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar5);
    *(undefined8 *)(puVar15 + -8) = 0x10821c;
    __PHYSFS_platformReleaseMutex(stateLock);
  }
  return 0;
}

Assistant:

int PHYSFS_enumerate(const char *_fn, PHYSFS_EnumerateCallback cb, void *data)
{
    PHYSFS_EnumerateCallbackResult retval = PHYSFS_ENUM_OK;
    size_t len;
    char *allocated_fname;
    char *fname;

    BAIL_IF(!_fn, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!cb, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);

    len = strlen(_fn) + longest_root + 1;
    allocated_fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    fname = allocated_fname + longest_root;
    if (!sanitizePlatformIndependentPath(_fn, fname))
        retval = PHYSFS_ENUM_STOP;
    else
    {
        DirHandle *i;
        SymlinkFilterData filterdata;

        if (!allowSymLinks)
        {
            memset(&filterdata, '\0', sizeof (filterdata));
            filterdata.callback = cb;
            filterdata.callbackData = data;
        } /* if */

        for (i = searchPath; (retval == PHYSFS_ENUM_OK) && i; i = i->next)
        {
            char *arcfname = fname;

            if (partOfMountPoint(i, arcfname))
                retval = enumerateFromMountPoint(i, arcfname, cb, _fn, data);

            else if (verifyPath(i, &arcfname, 0))
            {
                PHYSFS_Stat statbuf;
                if (!i->funcs->stat(i->opaque, arcfname, &statbuf))
                {
                    if (currentErrorCode() == PHYSFS_ERR_NOT_FOUND)
                        continue;  /* no such dir in this archive, skip it. */
                } /* if */

                if (statbuf.filetype != PHYSFS_FILETYPE_DIRECTORY)
                    continue;  /* not a directory in this archive, skip it. */

                else if ((!allowSymLinks) && (i->funcs->info.supportsSymlinks))
                {
                    filterdata.dirhandle = i;
                    filterdata.arcfname = arcfname;
                    filterdata.errcode = PHYSFS_ERR_OK;
                    retval = i->funcs->enumerate(i->opaque, arcfname,
                                                 enumCallbackFilterSymLinks,
                                                 _fn, &filterdata);
                    if (retval == PHYSFS_ENUM_ERROR)
                    {
                        if (currentErrorCode() == PHYSFS_ERR_APP_CALLBACK)
                            PHYSFS_setErrorCode(filterdata.errcode);
                    } /* if */
                } /* else if */
                else
                {
                    retval = i->funcs->enumerate(i->opaque, arcfname,
                                                 cb, _fn, data);
                } /* else */
            } /* else if */
        } /* for */

    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);

    __PHYSFS_smallFree(allocated_fname);

    return (retval == PHYSFS_ENUM_ERROR) ? 0 : 1;
}